

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O3

Status * __thiscall
google::protobuf::util::converter::JsonStreamParser::Parse
          (Status *__return_storage_ptr__,JsonStreamParser *this,StringPiece json)

{
  pointer pcVar1;
  size_t size;
  uint uVar2;
  Status *pSVar3;
  StringPiece chunk;
  StringPiece local_78;
  Status *local_48;
  StringPiece local_40;
  
  local_40.length_ = json.length_;
  local_40.ptr_ = json.ptr_;
  local_48 = __return_storage_ptr__;
  pcVar1 = local_40.ptr_;
  size = local_40.length_;
  if ((this->leftover_)._M_string_length != 0) {
    std::__cxx11::string::swap((string *)&this->chunk_storage_);
    local_78 = json;
    StrAppend(&this->chunk_storage_,(AlphaNum *)&local_78);
    pcVar1 = (this->chunk_storage_)._M_dataplus._M_p;
    size = (this->chunk_storage_)._M_string_length;
    if ((long)size < 0) {
      StringPiece::LogFatalSizeTooBig(size,"size_t to int conversion");
    }
  }
  local_40.length_ = size;
  local_40.ptr_ = pcVar1;
  uVar2 = protobuf::internal::UTF8SpnStructurallyValid(&local_40);
  if ((int)uVar2 < 1) {
    std::__cxx11::string::_M_replace
              ((ulong)&this->leftover_,0,(char *)(this->leftover_)._M_string_length,
               (ulong)local_40.ptr_);
    pSVar3 = local_48;
    Status::Status(local_48);
  }
  else {
    chunk = StringPiece::substr(&local_40,0,(ulong)uVar2);
    pSVar3 = local_48;
    ParseChunk(local_48,this,chunk);
    local_78 = StringPiece::substr(&local_40,(ulong)uVar2,0xffffffffffffffff);
    StrAppend(&this->leftover_,(AlphaNum *)&local_78);
  }
  return pSVar3;
}

Assistant:

util::Status JsonStreamParser::Parse(StringPiece json) {
  StringPiece chunk = json;
  // If we have leftovers from a previous chunk, append the new chunk to it
  // and create a new StringPiece pointing at the string's data. This could
  // be large but we rely on the chunks to be small, assuming they are
  // fragments of a Cord.
  if (!leftover_.empty()) {
    // Don't point chunk to leftover_ because leftover_ will be updated in
    // ParseChunk(chunk).
    chunk_storage_.swap(leftover_);
    StrAppend(&chunk_storage_, json);
    chunk = StringPiece(chunk_storage_);
  }

  // Find the structurally valid UTF8 prefix and parse only that.
  int n = internal::UTF8SpnStructurallyValid(chunk);
  if (n > 0) {
    util::Status status = ParseChunk(chunk.substr(0, n));

    // Any leftover characters are stashed in leftover_ for later parsing when
    // there is more data available.
    StrAppend(&leftover_, chunk.substr(n));
    return status;
  } else {
    leftover_.assign(chunk.data(), chunk.size());
    return util::Status();
  }
}